

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O3

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<double>_>::writeErrorBars
          (AccumulatorView<OpenMD::Utils::Accumulator<double>_> *this,ostream *stream,
          string *errorMessage,ErrorHandling errorHandling)

{
  size_t sVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  
  sVar1 = (this->super_RealAccumulator).Count_;
  if (errorHandling == CI95) {
    if (sVar1 == 0) goto LAB_001438e7;
    dVar2 = (this->super_RealAccumulator).Avg_;
    dVar4 = (this->super_RealAccumulator).Avg2_ - dVar2 * dVar2;
    dVar2 = 0.0;
    if (0.0 <= dVar4) {
      dVar2 = dVar4;
    }
    auVar3._8_4_ = (int)(sVar1 >> 0x20);
    auVar3._0_8_ = sVar1;
    auVar3._12_4_ = 0x45300000;
    dVar2 = (SQRT(dVar2) * 1.96) /
            SQRT((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    if ((long)ABS(dVar2) < 0x7ff0000000000000) goto LAB_001438ba;
  }
  else {
    if (errorHandling == Variance) {
      dVar2 = (this->super_RealAccumulator).Avg_;
      dVar4 = (this->super_RealAccumulator).Avg2_ - dVar2 * dVar2;
      dVar2 = 0.0;
      if (0.0 <= dVar4) {
        dVar2 = dVar4;
      }
    }
    else {
      dVar2 = 0.0;
      if (errorHandling == StdDev) {
        dVar2 = (this->super_RealAccumulator).Avg_;
        dVar4 = (this->super_RealAccumulator).Avg2_ - dVar2 * dVar2;
        dVar2 = 0.0;
        if (0.0 <= dVar4) {
          dVar2 = dVar4;
        }
        dVar2 = SQRT(dVar2);
      }
    }
    if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
      if (sVar1 != 0) {
LAB_001438ba:
        std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
        std::ostream::_M_insert<double>(dVar2);
        return;
      }
LAB_001438e7:
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
      return;
    }
  }
  snprintf(painCave.errMsg,2000,"%s",(errorMessage->_M_dataplus)._M_p);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      RealType err {};
      std::size_t count = RealAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = RealAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = RealAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = RealAccumulator::getVariance();
        break;
      default:
        break;
      }

      if (count == 0 && errorHandling == ErrorHandling::CI95) {
        stream << "\t";
      } else {
        if (std::isinf(err) || std::isnan(err)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << "\t";
          else
            stream << "\t" << err;
        }
      }
    }